

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

void __thiscall despot::Solver::~Solver(Solver *this)

{
  Solver *this_local;
  
  this->_vptr_Solver = (_func_int **)&PTR__Solver_0026e498;
  History::~History(&this->history_);
  return;
}

Assistant:

Solver::~Solver() {
}